

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::setDamping
          (btGeneric6DofSpring2Constraint *this,int index,btScalar damping,bool limitIfNeeded)

{
  if (index < 3) {
    (this->m_linearLimits).m_springDamping.m_floats[index] = damping;
    (this->m_linearLimits).m_springDampingLimited[index] = limitIfNeeded;
    return;
  }
  this->m_angularLimits[index - 3U].m_springDamping = damping;
  this->m_angularLimits[index - 3U].m_springDampingLimited = limitIfNeeded;
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setDamping(int index, btScalar damping, bool limitIfNeeded)
{
	btAssert((index >= 0) && (index < 6));
	if (index<3) {
		m_linearLimits.m_springDamping[index] = damping;
		m_linearLimits.m_springDampingLimited[index] = limitIfNeeded;
	} else {
		m_angularLimits[index - 3].m_springDamping = damping;
		m_angularLimits[index - 3].m_springDampingLimited = limitIfNeeded;
	}
}